

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemotelyControlledSampler.cpp
# Opt level: O1

int __thiscall
jaegertracing::samplers::RemotelyControlledSampler::close(RemotelyControlledSampler *this,int __fd)

{
  int iVar1;
  int extraout_EAX;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if (this->_running == true) {
    this->_running = false;
    std::unique_lock<std::mutex>::unlock(&local_28);
    std::condition_variable::notify_one();
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
    iVar1 = std::thread::join();
  }
  else {
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

void RemotelyControlledSampler::close()
{
    {
        std::unique_lock<std::mutex> lock(_mutex);
        if (!_running) {
            return;
        }
        _running = false;
        lock.unlock();
        _shutdownCV.notify_one();
    }
    _thread.join();
}